

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O2

void __thiscall cs_impl::any::protect(any *this)

{
  proxy *ppVar1;
  error *this_00;
  allocator local_31;
  string local_30;
  
  ppVar1 = this->mDat;
  if (ppVar1 != (proxy *)0x0) {
    if (1 < ppVar1->protect_level) {
      this_00 = (error *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_30,"E000G",&local_31);
      cov::error::error(this_00,&local_30);
      __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
    }
    ppVar1->protect_level = 1;
  }
  return;
}

Assistant:

void protect()
		{
			if (this->mDat != nullptr) {
				if (this->mDat->protect_level > 1)
					throw cov::error("E000G");
				this->mDat->protect_level = 1;
			}
		}